

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcDataStream::append_stream(CTcDataStream *this,CTcDataStream *stream)

{
  CTcStreamAnchor *pCVar1;
  ulong uVar2;
  CTcStreamAnchor *pCVar3;
  void **__n;
  CTcDataStream *in_RSI;
  CTcDataStream *in_RDI;
  ulong actual;
  char *ptr;
  ulong request;
  CTcStreamAnchor *nxt;
  CTcStreamAnchor *anchor;
  ulong start_ofs;
  ulong ofs;
  ulong rem;
  void *local_50;
  ulong *in_stack_ffffffffffffffb8;
  ulong requested_len;
  ulong in_stack_ffffffffffffffc8;
  CTcDataStream *in_stack_ffffffffffffffd0;
  ulong local_18;
  
  uVar2 = get_ofs(in_RDI);
  for (local_18 = get_ofs(in_RSI); local_18 != 0; local_18 = local_18 - (long)local_50) {
    requested_len = 0xffff;
    if (local_18 < 0xffff) {
      requested_len = local_18;
    }
    __n = &local_50;
    in_stack_ffffffffffffffb8 =
         (ulong *)get_block_ptr(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,requested_len,
                                in_stack_ffffffffffffffb8);
    write(in_RDI,(int)in_stack_ffffffffffffffb8,local_50,(size_t)__n);
  }
  pCVar3 = get_first_anchor(in_RSI);
  while (pCVar3 != (CTcStreamAnchor *)0x0) {
    pCVar1 = pCVar3->nxt_;
    pCVar3->ofs_ = uVar2 + pCVar3->ofs_;
    pCVar3->nxt_ = (CTcStreamAnchor *)0x0;
    if (in_RDI->last_anchor_ == (CTcStreamAnchor *)0x0) {
      in_RDI->first_anchor_ = pCVar3;
    }
    else {
      in_RDI->last_anchor_->nxt_ = pCVar3;
    }
    in_RDI->last_anchor_ = pCVar3;
    pCVar3 = pCVar1;
  }
  return;
}

Assistant:

void CTcDataStream::append_stream(CTcDataStream *stream)
{
    ulong rem;
    ulong ofs;
    ulong start_ofs;
    CTcStreamAnchor *anchor;
    CTcStreamAnchor *nxt;

    /* remember the starting offset of the copy in my stream */
    start_ofs = get_ofs();
    
    /* copy all data from the other stream */
    for (ofs = 0, rem = stream->get_ofs() ; rem != 0 ; )
    {
        ulong request;
        const char *ptr;
        ulong actual;

        /* 
         *   request as much as possible from the other stream, up to the
         *   remaining length or 64k, whichever is smaller 
         */
        request = 65535;
        if (rem < request)
            request = rem;

        /* get the chunk from the source stream */
        ptr = stream->get_block_ptr(ofs, request, &actual);

        /* 
         *   write this chunk (which we know is less than 64k and can thus
         *   be safely cast to size_t, even on 16-bit machines) 
         */
        write(ptr, (size_t)actual);

        /* advance our counters */
        rem -= actual;
        ofs += actual;
    }

    /*
     *   Now copy all of the anchors from the source stream to our stream.
     *   This will ensure that fixups in the other stream have
     *   corresponding fixups in this stream.  Note that we must adjust
     *   the offset of each copied anchor by the offset of the start of
     *   the copied data in our stream.  
     */
    for (anchor = stream->get_first_anchor() ; anchor != 0 ; anchor = nxt)
    {
        /* 
         *   remember the old link to the next anchor, since we're going
         *   to move the anchor to my list and thus forget about its
         *   position in the old list 
         */
        nxt = anchor->nxt_;

        /* adjust the anchor's offset */
        anchor->ofs_ += start_ofs;

        /* unlink the anchor from its old stream */
        anchor->nxt_ = 0;

        /* link it in to my anchor list */
        if (last_anchor_ != 0)
            last_anchor_->nxt_ = anchor;
        else
            first_anchor_ = anchor;
        last_anchor_ = anchor;
    }
}